

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreDisassembler.c
# Opt level: O0

DecodeStatus DecodeL6RInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  MCInst *in_RCX;
  uint *in_RDX;
  uint32_t in_ESI;
  uint in_EDI;
  DecodeStatus S;
  uint Op6;
  uint Op5;
  uint Op4;
  uint Op3;
  uint Op2;
  uint Op1;
  void *in_stack_ffffffffffffffc0;
  uint64_t in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 local_4;
  
  fieldFromInstruction_4(in_ESI,0,0x10);
  local_4 = Decode3OpInstruction
                      (in_EDI,(uint *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX,
                       &in_RCX->OpcodePub);
  if (local_4 == MCDisassembler_Success) {
    fieldFromInstruction_4(in_ESI,0x10,0x10);
    local_4 = Decode3OpInstruction
                        (in_EDI,(uint *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX,
                         &in_RCX->OpcodePub);
    if (local_4 == MCDisassembler_Success) {
      DecodeGRRegsRegisterClass
                (in_RCX,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8,
                 in_stack_ffffffffffffffc0);
      DecodeGRRegsRegisterClass
                (in_RCX,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8,
                 in_stack_ffffffffffffffc0);
      DecodeGRRegsRegisterClass
                (in_RCX,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8,
                 in_stack_ffffffffffffffc0);
      DecodeGRRegsRegisterClass
                (in_RCX,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8,
                 in_stack_ffffffffffffffc0);
      DecodeGRRegsRegisterClass
                (in_RCX,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8,
                 in_stack_ffffffffffffffc0);
      DecodeGRRegsRegisterClass
                (in_RCX,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8,
                 in_stack_ffffffffffffffc0);
    }
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeL6RInstruction(MCInst *Inst, unsigned Insn, uint64_t Address,
		const void *Decoder)
{
	unsigned Op1, Op2, Op3, Op4, Op5, Op6;
	DecodeStatus S =
		Decode3OpInstruction(fieldFromInstruction_4(Insn, 0, 16), &Op1, &Op2, &Op3);
	if (S != MCDisassembler_Success)
		return S;

	S = Decode3OpInstruction(fieldFromInstruction_4(Insn, 16, 16), &Op4, &Op5, &Op6);
	if (S != MCDisassembler_Success)
		return S;

	DecodeGRRegsRegisterClass(Inst, Op1, Address, Decoder);
	DecodeGRRegsRegisterClass(Inst, Op4, Address, Decoder);
	DecodeGRRegsRegisterClass(Inst, Op2, Address, Decoder);
	DecodeGRRegsRegisterClass(Inst, Op3, Address, Decoder);
	DecodeGRRegsRegisterClass(Inst, Op5, Address, Decoder);
	DecodeGRRegsRegisterClass(Inst, Op6, Address, Decoder);
	return S;
}